

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

char * mbedtls_ssl_get_ciphersuite_name(int ciphersuite_id)

{
  mbedtls_ssl_ciphersuite_t *cur;
  mbedtls_ssl_ciphersuite_t *pmVar1;
  char *pcVar2;
  int iVar3;
  
  pmVar1 = ciphersuite_definitions;
  iVar3 = 0xc0ad;
  do {
    if (iVar3 == ciphersuite_id) goto LAB_00211403;
    iVar3 = pmVar1[1].id;
    pmVar1 = pmVar1 + 1;
  } while (iVar3 != 0);
  pmVar1 = (mbedtls_ssl_ciphersuite_t *)0x0;
LAB_00211403:
  if (pmVar1 == (mbedtls_ssl_ciphersuite_t *)0x0) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = pmVar1->name;
  }
  return pcVar2;
}

Assistant:

const char *mbedtls_ssl_get_ciphersuite_name(const int ciphersuite_id)
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_id(ciphersuite_id);

    if (cur == NULL) {
        return "unknown";
    }

    return cur->name;
}